

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O0

uint8_t * bstr_match_bstr(uint8_t *pBegin,uint8_t *pEnd,uint8_t *pStrBegin,uint8_t *pStrEnd)

{
  int *piVar1;
  uint8_t *local_40;
  uint8_t *pStrNext;
  uint8_t *pNext;
  uint8_t *pStrEnd_local;
  uint8_t *pStrBegin_local;
  uint8_t *pEnd_local;
  uint8_t *pBegin_local;
  
  if ((pEnd < pBegin) || (local_40 = pStrBegin, pStrNext = pBegin, pStrEnd < pStrBegin)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    pBegin_local = (uint8_t *)0x0;
  }
  else {
    for (; pStrNext < pEnd; pStrNext = pStrNext + 1) {
      if (pStrEnd <= local_40) {
        return pStrNext;
      }
      if (*pStrNext != *local_40) {
        return (uint8_t *)0x0;
      }
      local_40 = local_40 + 1;
    }
    pBegin_local = pBegin;
    if (local_40 == pStrEnd) {
      pBegin_local = pStrNext;
    }
  }
  return pBegin_local;
}

Assistant:

const uint8_t *bstr_match_bstr(const uint8_t *pBegin, const uint8_t *pEnd, const uint8_t *pStrBegin, const uint8_t *pStrEnd)
{
   const uint8_t *pNext = pBegin;
   const uint8_t *pStrNext = pStrBegin;
   if ( (pBegin > pEnd) || (pStrBegin > pStrEnd) )
   {
      errno = EINVAL; //invalid arguments
      return 0;
   }
   while(pNext < pEnd){
      if (pStrNext < pStrEnd)
      {
         if (*pNext != *pStrNext)
         {
            return 0; //string did not match
         }
      }
      else
      {
         //All characters in pStr has been successfully matched
         return pNext; //pNext should point to pStrEnd at this point
      }
      pNext++;
      pStrNext++;
   }
   if (pStrNext == pStrEnd)
   {
      return pNext; //All characters in pStr has been successfully matched
   }
   return pBegin; //reached pEnd before pStr was fully matched
}